

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_div__Test::~correctness_div__Test(correctness_div__Test *this)

{
  void *in_RDI;
  
  ~correctness_div__Test((correctness_div__Test *)0x127658);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(correctness, div_)
{
    big_integer a = 20;
    big_integer b = 5;
    big_integer c = 20;

    EXPECT_TRUE(a / b == 4);
    EXPECT_TRUE(a % b == 0);

    a /= b;
    EXPECT_TRUE(a == 4);

    c %= b;
    EXPECT_TRUE(c == 0);
}